

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

void __thiscall Fl_Tree_Item::_Init(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs,Fl_Tree *tree)

{
  Fl_Color FVar1;
  Fl_Color FVar2;
  Fl_Fontsize FVar3;
  
  this->_label = (char *)0x0;
  FVar3 = prefs->_labelsize;
  FVar1 = prefs->_labelfgcolor;
  FVar2 = prefs->_labelbgcolor;
  this->_labelfont = prefs->_labelfont;
  this->_labelsize = FVar3;
  this->_labelfgcolor = FVar1;
  this->_labelbgcolor = FVar2;
  this->_widget = (Fl_Widget *)0x0;
  this->_usericon = (Fl_Image *)0x0;
  this->_open = '\x01';
  this->_visible = '\x01';
  this->_active = '\x01';
  *(undefined8 *)&this->_selected = 0;
  *(undefined8 *)((long)this->_xywh + 7) = 0;
  *(undefined8 *)((long)this->_xywh + 0xf) = 0;
  *(undefined8 *)((long)this->_collapse_xywh + 7) = 0;
  *(undefined8 *)((long)this->_collapse_xywh + 0xf) = 0;
  *(undefined8 *)((long)this->_label_xywh + 7) = 0;
  *(undefined1 *)((long)this->_label_xywh + 0xf) = 0;
  this->_parent = (Fl_Tree_Item *)0x0;
  this->_userdata = (void *)0x0;
  return;
}

Assistant:

void Fl_Tree_Item::_Init(const Fl_Tree_Prefs &prefs, Fl_Tree *tree) {
#if FLTK_ABI_VERSION >= 10303
  _tree         = tree;
#endif
  _label        = 0;
  _labelfont    = prefs.labelfont();
  _labelsize    = prefs.labelsize();
  _labelfgcolor = prefs.labelfgcolor();
  _labelbgcolor = prefs.labelbgcolor();
  _widget       = 0;
#if FLTK_ABI_VERSION >= 10301
  _flags        = OPEN|VISIBLE|ACTIVE;
#else /*FLTK_ABI_VERSION*/
  _open         = 1;
  _visible      = 1;
  _active       = 1;
  _selected     = 0;
#endif /*FLTK_ABI_VERSION*/
  _xywh[0]      = 0;
  _xywh[1]      = 0;
  _xywh[2]      = 0;
  _xywh[3]      = 0;
  _collapse_xywh[0] = 0;
  _collapse_xywh[1] = 0;
  _collapse_xywh[2] = 0;
  _collapse_xywh[3] = 0;
  _label_xywh[0]    = 0;
  _label_xywh[1]    = 0;
  _label_xywh[2]    = 0;
  _label_xywh[3]    = 0;
  _usericon         = 0;
#if FLTK_ABI_VERSION >= 10304
  _userdeicon       = 0;
#endif
  _userdata         = 0;
  _parent           = 0;
#if FLTK_ABI_VERSION >= 10303
  _children.manage_item_destroy(1);	// let array's dtor manage destroying Fl_Tree_Items
#endif
#if FLTK_ABI_VERSION >= 10301
  _prev_sibling     = 0;
  _next_sibling     = 0;
#endif /*FLTK_ABI_VERSION*/
}